

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseBuilder::_newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,uint32_t typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  byte bVar1;
  undefined1 auVar2 [16];
  EmbedDataNode **ppEVar3;
  int iVar4;
  Error EVar5;
  ulong size;
  anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *__dest;
  Error EStack_50;
  EmbedDataNode *node;
  void *local_40;
  EmbedDataNode **local_38;
  
  *out = (EmbedDataNode *)0x0;
  iVar4 = 0;
  if ((typeId & 0xfffffffe) == 0x20) {
    iVar4 = (uint)(((this->super_BaseEmitter)._environment._arch & 1) == 0) * 2 + 6;
  }
  if ((iVar4 + typeId) - 0x20 < 0x45) {
    bVar1 = Type::_typeData[(ulong)(iVar4 + typeId) + 0x100];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = itemCount;
    auVar2 = auVar2 * ZEXT116(bVar1);
    size = auVar2._0_8_;
    if (auVar2._8_8_ == 0) {
      local_40 = data;
      local_38 = out;
      EVar5 = _newNodeT<asmjit::EmbedDataNode>(this,&node);
      if (EVar5 == 0) {
        (node->super_BaseNode).field_1._any._reserved0 = (uint8_t)typeId;
        (node->super_BaseNode).field_1._any._reserved1 = bVar1;
        node->_itemCount = itemCount;
        node->_repeatCount = repeatCount;
        if (size < 0x41) {
          __dest = &node->field_2;
        }
        else {
          __dest = (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)
                   Zone::alloc(&this->_dataZone,size,8);
          if (__dest == (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)0x0) {
            EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
            return EVar5;
          }
          (node->field_2)._externalData = (uint8_t *)__dest;
        }
        ppEVar3 = local_38;
        if (local_40 != (void *)0x0) {
          memcpy(__dest,local_40,size);
        }
        *ppEVar3 = node;
        EVar5 = 0;
      }
      return EVar5;
    }
    EStack_50 = 1;
  }
  else {
    EStack_50 = 2;
  }
  EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,EStack_50,(char *)0x0);
  return EVar5;
}

Assistant:

Error BaseBuilder::_newEmbedDataNode(EmbedDataNode** out, uint32_t typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = Type::deabstractDeltaOfSize(registerSize());
  uint32_t finalTypeId = Type::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!Type::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = Type::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = uint8_t(typeId);
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}